

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_operation.c
# Opt level: O2

void async_operation_destroy(ASYNC_OPERATION_HANDLE async_operation)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (async_operation != (ASYNC_OPERATION_HANDLE)0x0) {
    free(async_operation);
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/async_operation.c"
               ,"async_operation_destroy",0x3a,1,"NULL async_operation");
    return;
  }
  return;
}

Assistant:

void async_operation_destroy(ASYNC_OPERATION_HANDLE async_operation)
{
    if (async_operation == NULL)
    {
        /* Codes_SRS_ASYNC_OPERATION_01_006: [ If `async_operation` is NULL, `async_operation_destroy` shall do nothing.]*/
        LogError("NULL async_operation");
    }
    else
    {
        /* Codes_SRS_ASYNC_OPERATION_01_005: [ `async_operation_destroy` shall free all recources associated with the asyncronous operation instance.]*/
        free(async_operation);
    }
}